

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall QByteArray::append(QByteArray *this,char ch)

{
  QArrayDataPointer<char>::detachAndGrow
            (&this->d,GrowsAtEnd,1,(char **)0x0,(QArrayDataPointer<char> *)0x0);
  QtPrivate::QPodArrayOps<char>::copyAppend((QPodArrayOps<char> *)this,1,ch);
  (this->d).ptr[(this->d).size] = '\0';
  return this;
}

Assistant:

QByteArray& QByteArray::append(char ch)
{
    d.detachAndGrow(QArrayData::GrowsAtEnd, 1, nullptr, nullptr);
    d->copyAppend(1, ch);
    d.data()[d.size] = '\0';
    return *this;
}